

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O2

void __thiscall henson::NameMap::create_queue(NameMap *this,string *name)

{
  queue<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  qStack_68;
  
  std::
  queue<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>>
  ::
  queue<std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>,void>
            (&qStack_68);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::queue<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::queue<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::queue<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>>>>>
  ::
  _M_emplace_unique<std::__cxx11::string_const&,std::queue<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::queue<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::queue<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::queue<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>>>>>
              *)&this->queues_,name,&qStack_68);
  std::
  deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~deque(&qStack_68.c);
  return;
}

Assistant:

void        create_queue(const std::string& name)               { queues_.emplace(name, ValueQueue()); }